

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O2

void Fra_ClausEstimateCoverageOne(Fra_Sml_t *pSim,int *pLits,int nLits,int *pVar2Id,uint *pResult)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint *puStack_88;
  uint *pSims [16];
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)nLits;
  if (nLits < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    pSims[uVar4 - 1] =
         (uint *)((long)&pSim[1].pAig +
                 (long)pSim->nWordsTotal * (long)pVar2Id[pLits[uVar4] >> 1] * 4);
  }
  for (lVar1 = 0; lVar1 < pSim->nWordsTotal; lVar1 = lVar1 + 1) {
    pResult[lVar1] = 0xffffffff;
    uVar3 = 0xffffffff;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar3 = uVar3 & ((pLits[uVar4] & 1U) - 1 ^ pSims[uVar4 - 1][lVar1]);
      pResult[lVar1] = uVar3;
    }
  }
  return;
}

Assistant:

void Fra_ClausEstimateCoverageOne( Fra_Sml_t * pSim, int * pLits, int nLits, int * pVar2Id, unsigned * pResult )
{
    unsigned * pSims[16];
    int iVar, i, w;
    for ( i = 0; i < nLits; i++ )
    {
        iVar = lit_var(pLits[i]);
        pSims[i] = Fra_ObjSim( pSim, pVar2Id[iVar] );
    }
    for ( w = 0; w < pSim->nWordsTotal; w++ )
    {
        pResult[w] = ~(unsigned)0;
        for ( i = 0; i < nLits; i++ )
            pResult[w] &= (lit_sign(pLits[i])? pSims[i][w] : ~pSims[i][w]);
    }
}